

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_make_ryuma_mayor_saveable.hpp
# Opt level: O2

void __thiscall PatchMakeRyumaMayorSaveable::alter_rom(PatchMakeRyumaMayorSaveable *this,ROM *rom)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  ushort uVar3;
  uint32_t longWord;
  Code *pCVar4;
  Code local_98;
  
  p_Var1 = &local_98._pending_branches._M_t._M_impl.super__Rb_tree_header;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._labels._M_t._M_impl._0_8_ = 0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._pending_branches._M_t._M_impl._0_8_ = 0;
  local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var2 = &local_98._labels._M_t._M_impl.super__Rb_tree_header;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  pCVar4 = md::Code::rts(&local_98);
  md::ROM::set_code(rom,0x136be,pCVar4);
  md::Code::~Code(&local_98);
  longWord = md::ROM::get_long(rom,0x28364);
  md::ROM::set_long(rom,0x28362,longWord);
  uVar3 = *(ushort *)
           ((rom->_byte_array).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start + 0x2546a);
  md::ROM::set_word(rom,0x2546a,(uVar3 << 8 | uVar3 >> 8) - 2);
  md::ROM::set_word(rom,0x28366,0x1421);
  md::ROM::set_word(rom,0x2546c,0x2f39);
  md::ROM::set_word(rom,0x9ba62,0xfefe);
  md::ROM::set_byte(rom,0x2837e,'\0');
  md::ROM::set_word(rom,0x28380,0x17e8);
  md::ROM::set_word(rom,0x2648e,0xf908);
  md::ROM::set_word(rom,0x26490,0x23);
  md::ROM::set_word(rom,0x26492,0x1801);
  md::ROM::set_word(rom,0x26494,0x17ff);
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._labels._M_t._M_impl._0_8_ = 0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._pending_branches._M_t._M_impl._0_8_ = 0;
  local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  pCVar4 = md::Code::rts(&local_98);
  md::ROM::set_code(rom,0x26496,pCVar4);
  md::Code::~Code(&local_98);
  md::ROM::set_long(rom,0x26498,0xffffffff);
  return;
}

Assistant:

void alter_rom(md::ROM& rom) override
    {
        // Disable the cutscene (CSA_0068) when opening vanilla lithograph chest
        rom.set_code(0x136BE, md::Code().rts());

        // Shifts the boss cutscene right before to make room for one more instruction in mayor cutscene
        rom.set_long(0x28362, rom.get_long(0x28364));
        rom.set_word(0x2546A, rom.get_word(0x2546A) - 2);

        // Set the bit 1 of flag 1004 as the first instruction in mayor's cutscene, and move starting
        // offset of this cutscene accordingly
        rom.set_word(0x28366, 0x1421);
        rom.set_word(0x2546C, 0x2F39);

        // Edit Friday blocker behavior in the treasure room
        rom.set_word(0x9BA62, 0xFEFE);

        // Change the second mayor reward from "fixed 100 golds" to "item with ID located at 0x2837F"
        rom.set_byte(0x2837E, 0x00);
        rom.set_word(0x28380, 0x17E8);

        // Remove the "I think we need an exorcism" dialogue for the mayor when progression flags are much further in the game
        rom.set_word(0x2648E, 0xF908); // CheckFlagAndDisplayMessage
        rom.set_word(0x26490, 0x0023); // on bit 3 of flag FF1004
        rom.set_word(0x26492, 0x1801); // Script ID for post-reward dialogue
        rom.set_word(0x26494, 0x17FF); // Script ID for reward cutscene
        rom.set_code(0x26496, md::Code().rts());
        // Clear out the rest
        rom.set_long(0x26498, 0xFFFFFFFF);
    }